

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerWithAttr::GetProperty
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,Var originalInstance,
          PropertyId propertyId,Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  ObjectSlotAttributes attributes;
  PropertyAttributes attributes_00;
  uint16 uVar1;
  PropertyIndex index_00;
  TypePath *this_00;
  ObjectSlotAttributes **ppOVar2;
  Var pvVar3;
  RecyclableObject *function;
  RecyclableObject *func;
  ObjectSlotAttributes attr;
  PropertyIndex index;
  PropertyValueInfo *info_local;
  Var *value_local;
  PropertyId propertyId_local;
  Var originalInstance_local;
  DynamicObject *instance_local;
  PathTypeHandlerWithAttr *this_local;
  
  this_00 = PathTypeHandlerBase::GetTypePath((PathTypeHandlerBase *)this);
  uVar1 = PathTypeHandlerBase::GetPathLength((PathTypeHandlerBase *)this);
  index_00 = TypePath::LookupInline(this_00,propertyId,(uint)uVar1);
  if (index_00 == 0xffff) {
    this_local._4_4_ =
         PathTypeHandlerBase::GetProperty
                   ((PathTypeHandlerBase *)this,instance,originalInstance,propertyId,value,info,
                    requestContext);
  }
  else {
    ppOVar2 = Memory::WriteBarrierPtr::operator_cast_to_ObjectSlotAttributes__
                        ((WriteBarrierPtr *)&this->attributes);
    attributes = (*ppOVar2)[index_00];
    if ((attributes & ObjectSlotAttr_Deleted) == ObjectSlotAttr_None) {
      if ((attributes & ObjectSlotAttr_Accessor) == ObjectSlotAttr_None) {
        pvVar3 = DynamicObject::GetSlot(instance,(uint)index_00);
        *value = pvVar3;
        PathTypeHandlerBase::SetPropertyValueInfo
                  ((PathTypeHandlerBase *)this,info,&instance->super_RecyclableObject,index_00,
                   attributes);
        this_local._4_4_ = 1;
      }
      else {
        attributes_00 = PathTypeHandlerBase::ObjectSlotAttributesToPropertyAttributes(attributes);
        PropertyValueInfo::Set
                  (info,&instance->super_RecyclableObject,index_00,attributes_00,InlineCacheNoFlags)
        ;
        CacheOperators::CachePropertyReadForGetter(info,originalInstance,propertyId,requestContext);
        PropertyValueInfo::SetNoCache(info,&instance->super_RecyclableObject);
        pvVar3 = DynamicObject::GetSlot(instance,(uint)index_00);
        function = UnsafeVarTo<Js::RecyclableObject>(pvVar3);
        pvVar3 = Js::JavascriptOperators::CallGetter(function,originalInstance,requestContext);
        *value = pvVar3;
        this_local._4_4_ = 1;
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL PathTypeHandlerWithAttr::GetProperty(DynamicObject* instance, Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyIndex index = GetTypePath()->LookupInline(propertyId, GetPathLength());
        if (index == Constants::NoSlot)
        {
            return __super::GetProperty(instance, originalInstance, propertyId, value, info, requestContext);
        }

        ObjectSlotAttributes attr = attributes[index];
        if (attr & ObjectSlotAttr_Deleted)
        {
            return false;
        }

        if (attr & ObjectSlotAttr_Accessor)
        {
            // We must update cache before calling a getter, because it can invalidate something. Bug# 593815
            PropertyValueInfo::Set(info, instance, index, ObjectSlotAttributesToPropertyAttributes(attr));
            CacheOperators::CachePropertyReadForGetter(info, originalInstance, propertyId, requestContext);
            PropertyValueInfo::SetNoCache(info, instance); // we already cached getter, so we don't have to do it once more

            RecyclableObject* func = UnsafeVarTo<RecyclableObject>(instance->GetSlot(index));
            *value = JavascriptOperators::CallGetter(func, originalInstance, requestContext);
            return true;
        }

        *value = instance->GetSlot(index);
        this->SetPropertyValueInfo(info, instance, index, attr);
        return true;
    }